

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::CombinedImageSampler,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::operator=
          (SmallVector<spirv_cross::CombinedImageSampler,_8UL> *this,
          SmallVector<spirv_cross::CombinedImageSampler,_8UL> *other)

{
  VariableID VVar1;
  CombinedImageSampler *pCVar2;
  CombinedImageSampler *pCVar3;
  ulong local_28;
  size_t i;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *other_local;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size);
    for (local_28 = 0;
        local_28 < (other->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size;
        local_28 = local_28 + 1) {
      pCVar2 = (this->super_VectorView<spirv_cross::CombinedImageSampler>).ptr + local_28;
      pCVar3 = (other->super_VectorView<spirv_cross::CombinedImageSampler>).ptr + local_28;
      VVar1.id = (pCVar3->image_id).id;
      pCVar2->combined_id = (VariableID)(pCVar3->combined_id).id;
      pCVar2->image_id = (VariableID)VVar1.id;
      (pCVar2->sampler_id).id = (pCVar3->sampler_id).id;
    }
    (this->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size =
         (other->super_VectorView<spirv_cross::CombinedImageSampler>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}